

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

double sqlite3VdbeRealValue(Mem *pMem)

{
  Mem *local_20;
  double val;
  Mem *pMem_local;
  
  if ((pMem->flags & 8) == 0) {
    if ((pMem->flags & 4) == 0) {
      if ((pMem->flags & 0x12) == 0) {
        pMem_local = (Mem *)0x0;
      }
      else {
        local_20 = (Mem *)0x0;
        val = (double)pMem;
        sqlite3AtoF(pMem->z,(double *)&local_20,pMem->n,pMem->enc);
        pMem_local = local_20;
      }
    }
    else {
      pMem_local = (Mem *)(double)(pMem->u).i;
    }
  }
  else {
    pMem_local = (Mem *)pMem->r;
  }
  return (double)pMem_local;
}

Assistant:

SQLITE_PRIVATE double sqlite3VdbeRealValue(Mem *pMem){
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );
  if( pMem->flags & MEM_Real ){
    return pMem->r;
  }else if( pMem->flags & MEM_Int ){
    return (double)pMem->u.i;
  }else if( pMem->flags & (MEM_Str|MEM_Blob) ){
    /* (double)0 In case of SQLITE_OMIT_FLOATING_POINT... */
    double val = (double)0;
    sqlite3AtoF(pMem->z, &val, pMem->n, pMem->enc);
    return val;
  }else{
    /* (double)0 In case of SQLITE_OMIT_FLOATING_POINT... */
    return (double)0;
  }
}